

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::TreeEnsembleParameters::ByteSizeLong(TreeEnsembleParameters *this)

{
  uint uVar1;
  int iVar2;
  TreeEnsembleParameters_TreeNode *value;
  size_t sVar3;
  size_t sVar4;
  uint64 uVar5;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  uint local_20;
  uint count_1;
  uint i;
  uint count;
  size_t total_size;
  TreeEnsembleParameters *this_local;
  
  uVar1 = nodes_size(this);
  _i = (size_t)uVar1;
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    value = nodes(this,local_20);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleParameters_TreeNode>(value);
    _i = sVar3 + _i;
  }
  uVar1 = basepredictionvalue_size(this);
  sVar3 = (ulong)uVar1 * 8;
  if ((ulong)uVar1 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    _i = sVar4 + 1 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_basepredictionvalue_cached_byte_size_ = iVar2;
  _i = sVar3 + _i;
  uVar5 = numpredictiondimensions(this);
  if (uVar5 != 0) {
    uVar5 = numpredictiondimensions(this);
    sVar3 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar5);
    _i = sVar3 + 1 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar2;
  return _i;
}

Assistant:

size_t TreeEnsembleParameters::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleParameters)
  size_t total_size = 0;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
  {
    unsigned int count = this->nodes_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->nodes(i));
    }
  }

  // repeated double basePredictionValue = 3;
  {
    unsigned int count = this->basepredictionvalue_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _basepredictionvalue_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // uint64 numPredictionDimensions = 2;
  if (this->numpredictiondimensions() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->numpredictiondimensions());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}